

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

void __thiscall sophia_interface::debugNonLUND(sophia_interface *this,string *errm,bool stopProgram)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  long lVar3;
  double (*padVar4) [2000];
  int i;
  long lVar5;
  double dVar6;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"debugNonLUND: ");
  poVar2 = std::operator<<(poVar2,(string *)errm);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"np = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->np);
  std::endl<char,std::char_traits<char>>(poVar2);
  padVar4 = this->p;
  for (lVar5 = 0; lVar5 < this->np; lVar5 = lVar5 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"ID = ");
    iVar1 = ID_sophia_to_PDG(this->LLIST[lVar5]);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    for (lVar3 = 0; lVar3 != 80000; lVar3 = lVar3 + 16000) {
      std::operator<<((ostream *)&std::cout,"|P\t");
      poVar2 = std::ostream::_M_insert<double>(*(double *)((long)*padVar4 + lVar3));
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    padVar4 = (double (*) [2000])(*padVar4 + 1);
  }
  std::operator<<((ostream *)&std::cout,"test random number: ");
  dVar6 = RNDM(this);
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  if (!stopProgram) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"stopped by debugNonLUND.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void sophia_interface::debugNonLUND(std::string errm, bool stopProgram) {
    std::cout << "------------------------------------" << std::endl;
    std::cout << "debugNonLUND: " << errm << std::endl;
    std::cout << "np = "<< np << std::endl;
    for (int i = 0; i < np; ++i) {
        std::cout << "ID = " << ID_sophia_to_PDG(LLIST[i]) << std::endl;
        for (int j = 0; j < 5; ++j) {
            std::cout << "|P\t" << p[j][i] << std::endl;
        }
    }
    std::cout << "test random number: " << RNDM() << std::endl;
    std::cout << "------------------------------------" << std::endl;
    if (stopProgram) throw std::runtime_error("stopped by debugNonLUND.");
}